

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O2

void mainchan_log_exit_signal_common(mainchan *mc,char *sigdesc,_Bool core_dumped,ptrlen msg)

{
  LogContext *ctx;
  uint uVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  size_t s;
  char *pcVar3;
  char *pcVar4;
  
  s = msg.len;
  pcVar4 = " (core dumped)";
  if ((int)CONCAT71(in_register_00000011,core_dumped) == 0) {
    pcVar4 = anon_var_dwarf_3291b + 10;
  }
  pcVar3 = " (";
  if (s == 0) {
    pcVar3 = anon_var_dwarf_3291b + 10;
  }
  pcVar2 = ")";
  if (s == 0) {
    pcVar2 = anon_var_dwarf_3291b + 10;
  }
  ctx = mc->ppl->logctx;
  uVar1 = string_length_for_printf(s);
  pcVar4 = dupprintf("Session exited on %s%s%s%.*s%s",sigdesc,pcVar4,pcVar3,(ulong)uVar1,msg.ptr,
                     pcVar2);
  logevent_and_free(ctx,pcVar4);
  return;
}

Assistant:

static void mainchan_log_exit_signal_common(
    mainchan *mc, const char *sigdesc,
    bool core_dumped, ptrlen msg)
{
    PacketProtocolLayer *ppl = mc->ppl; /* for ppl_logevent */

    const char *core_msg = core_dumped ? " (core dumped)" : "";
    const char *msg_pre = (msg.len ? " (" : "");
    const char *msg_post = (msg.len ? ")" : "");
    ppl_logevent("Session exited on %s%s%s%.*s%s",
                 sigdesc, core_msg, msg_pre, PTRLEN_PRINTF(msg), msg_post);
}